

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogMQ.cpp
# Opt level: O0

void __thiscall liblogger::LogMQ::LogMQ(LogMQ *this,string *qname)

{
  mqd_t mVar1;
  char *__name;
  ostream *poVar2;
  undefined8 uVar3;
  string *in_RSI;
  ILogger *in_RDI;
  stringstream ss;
  string *message;
  undefined7 in_stack_fffffffffffffe30;
  undefined1 uVar4;
  stringstream local_1a8 [16];
  ostream local_198 [392];
  string *local_10;
  
  local_10 = in_RSI;
  ILogger::ILogger(in_RDI);
  in_RDI->_vptr_ILogger = (_func_int **)&PTR__LogMQ_001cc658;
  message = (string *)(in_RDI + 1);
  std::__cxx11::string::string((string *)message,local_10);
  __name = (char *)std::__cxx11::string::c_str();
  mVar1 = mq_open(__name,1,0x180,0);
  *(mqd_t *)&in_RDI[5]._vptr_ILogger = mVar1;
  if (*(int *)&in_RDI[5]._vptr_ILogger < 0) {
    std::__cxx11::stringstream::stringstream(local_1a8);
    poVar2 = std::operator<<(local_198,"failed to open queue \'");
    poVar2 = std::operator<<(poVar2,local_10);
    std::operator<<(poVar2,"\'");
    uVar4 = 1;
    uVar3 = __cxa_allocate_exception(0x28);
    std::__cxx11::stringstream::str();
    LogException::LogException((LogException *)CONCAT17(uVar4,in_stack_fffffffffffffe30),message);
    __cxa_throw(uVar3,&LogException::typeinfo,LogException::~LogException);
  }
  return;
}

Assistant:

LogMQ::LogMQ(const std::string &qname) :
	m_QName(qname)
{
	m_id = mq_open(qname.c_str(), O_WRONLY,  S_IRUSR | S_IWUSR, NULL);
	if (m_id < 0) {
		std::stringstream ss;
		ss << "failed to open queue '" << qname << "'";
		throw(LogException(ss.str()));
	}
}